

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  double dVar3;
  double dVar4;
  
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  minunit_status = '\0';
  pcVar2 = (char *)labpack_version();
  minunit_assert = minunit_assert + 1;
  __s1 = "<null pointer>";
  if (pcVar2 != (char *)0x0) {
    __s1 = pcVar2;
  }
  iVar1 = strcmp(__s1,"0.1.0");
  if (iVar1 == 0) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001012f9;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: \'%s\' expected but was \'%s\'",
             "test_version_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/version.c"
             ,0x28,__s1,"0.1.0");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001012f9:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  iVar1 = labpack_version_major();
  if (iVar1 == 0) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001013e5;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_version_major_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/version.c"
             ,0x2d,"Version major number does not match");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001013e5:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  iVar1 = labpack_version_minor();
  if (iVar1 == 1) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_001014cb;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_version_minor_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/version.c"
             ,0x32,"Version minor number does not match");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_001014cb:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  minunit_status = '\0';
  minunit_assert = minunit_assert + 1;
  iVar1 = labpack_version_patch();
  if (iVar1 == 0) {
    putchar(0x2e);
    minunit_run = minunit_run + 1;
    if (minunit_status != '\x01') goto LAB_001015d5;
  }
  else {
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_version_patch_works",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/tests/version.c"
             ,0x37,"Version patch number does not match");
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
  }
  minunit_fail = minunit_fail + 1;
  putchar(0x46);
  printf("\n%s\n",minunit_last_message);
LAB_001015d5:
  fflush(_stdout);
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar3 = mu_timer_real();
  dVar4 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",dVar3 - minunit_real_timer,
         dVar4 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

MU_TEST_SUITE(versions)
{
    MU_RUN_TEST(test_version_works);
    MU_RUN_TEST(test_version_major_works);
    MU_RUN_TEST(test_version_minor_works);
    MU_RUN_TEST(test_version_patch_works);
}